

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O0

Rect __thiscall
GuillotineBinPack::Insert
          (GuillotineBinPack *this,int width,int height,bool merge,
          FreeRectChoiceHeuristic rectChoice,GuillotineSplitHeuristic splitMethod)

{
  bool bVar1;
  Rect *freeRect;
  uint local_38;
  GuillotineSplitHeuristic local_34;
  int freeNodeIndex;
  GuillotineSplitHeuristic splitMethod_local;
  FreeRectChoiceHeuristic rectChoice_local;
  int iStack_24;
  bool merge_local;
  int height_local;
  int width_local;
  GuillotineBinPack *this_local;
  Rect newRect;
  
  local_38 = 0;
  local_34 = splitMethod;
  freeNodeIndex = rectChoice;
  splitMethod_local._3_1_ = merge;
  rectChoice_local = height;
  iStack_24 = width;
  _height_local = this;
  _this_local = FindPositionForNewNode(this,width,height,rectChoice,(int *)&local_38);
  if (newRect.y != 0) {
    freeRect = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(long)(int)local_38);
    SplitFreeRectByHeuristic(this,freeRect,(Rect *)&this_local,local_34);
    TArray<Rect,_Rect>::Delete(&this->freeRectangles,local_38);
    if ((splitMethod_local._3_1_ & 1) != SplitShorterLeftoverAxis >> 0x18) {
      MergeFreeList(this);
    }
    TArray<Rect,_Rect>::Push(&this->usedRectangles,(Rect *)&this_local);
    bVar1 = DisjointRectCollection::Add(&this->disjointRects,(Rect *)&this_local);
    if (!bVar1) {
      __assert_fail("disjointRects.Add(newRect) == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/GuillotineBinPack.cpp"
                    ,0x169,
                    "Rect GuillotineBinPack::Insert(int, int, bool, FreeRectChoiceHeuristic, GuillotineSplitHeuristic)"
                   );
    }
  }
  return _this_local;
}

Assistant:

Rect GuillotineBinPack::Insert(int width, int height, bool merge, FreeRectChoiceHeuristic rectChoice, 
	GuillotineSplitHeuristic splitMethod)
{
	// Find where to put the new rectangle.
	int freeNodeIndex = 0;
	Rect newRect = FindPositionForNewNode(width, height, rectChoice, &freeNodeIndex);

	// Abort if we didn't have enough space in the bin.
	if (newRect.height == 0)
		return newRect;

	// Remove the space that was just consumed by the new rectangle.
	SplitFreeRectByHeuristic(freeRectangles[freeNodeIndex], newRect, splitMethod);
	freeRectangles.Delete(freeNodeIndex);

	// Perform a Rectangle Merge step if desired.
	if (merge)
		MergeFreeList();

	// Remember the new used rectangle.
	usedRectangles.Push(newRect);

	// Check that we're really producing correct packings here.
#ifdef _DEBUG
	assert(disjointRects.Add(newRect) == true);
#endif
	return newRect;
}